

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O0

int uv__platform_loop_init(uv_loop_t *loop)

{
  void *pvVar1;
  int iVar2;
  int *piVar3;
  uv__loop_internal_fields_t *lfields;
  uv_loop_t *loop_local;
  
  pvVar1 = loop->internal_fields;
  *(undefined4 *)((long)pvVar1 + 0x140) = 0xffffffff;
  *(undefined4 *)((long)pvVar1 + 0x1c8) = 0xffffffff;
  loop->inotify_watchers = (void *)0x0;
  loop->inotify_fd = -1;
  iVar2 = epoll_create1(0x80000);
  loop->backend_fd = iVar2;
  if (loop->backend_fd == -1) {
    piVar3 = __errno_location();
    loop_local._4_4_ = -*piVar3;
  }
  else {
    uv__iou_init(loop->backend_fd,(uv__iou *)((long)pvVar1 + 0x150),0x40,2);
    uv__iou_init(loop->backend_fd,(uv__iou *)((long)pvVar1 + 200),0x100,0);
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

int uv__platform_loop_init(uv_loop_t* loop) {
  uv__loop_internal_fields_t* lfields;

  lfields = uv__get_internal_fields(loop);
  lfields->ctl.ringfd = -1;
  lfields->iou.ringfd = -1;

  loop->inotify_watchers = NULL;
  loop->inotify_fd = -1;
  loop->backend_fd = epoll_create1(O_CLOEXEC);

  if (loop->backend_fd == -1)
    return UV__ERR(errno);

  uv__iou_init(loop->backend_fd, &lfields->iou, 64, UV__IORING_SETUP_SQPOLL);
  uv__iou_init(loop->backend_fd, &lfields->ctl, 256, 0);

  return 0;
}